

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_mac.c
# Opt level: O2

err_t beltMAC(octet *mac,void *src,size_t count,octet *key,size_t len)

{
  bool_t bVar1;
  blob_t state;
  err_t eVar2;
  
  eVar2 = 0x6d;
  if ((len < 0x21) && ((0x101010000U >> (len & 0x3f) & 1) != 0)) {
    bVar1 = memIsValid(src,count);
    if (bVar1 != 0) {
      bVar1 = memIsValid(key,len);
      if (bVar1 != 0) {
        bVar1 = memIsValid(mac,8);
        if (bVar1 != 0) {
          state = blobCreate(0x68);
          if (state == (blob_t)0x0) {
            eVar2 = 0x6e;
          }
          else {
            beltMACStart(state,key,len);
            beltMACStepA(src,count,state);
            beltMACStepG(mac,state);
            blobClose(state);
            eVar2 = 0;
          }
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t beltMAC(octet mac[8], const void* src, size_t count,
	const octet key[], size_t len)
{
	void* state;
	// проверить входные данные
	if (len != 16 && len != 24 && len != 32 ||
		!memIsValid(src, count) ||
		!memIsValid(key, len) ||
		!memIsValid(mac, 8))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltMAC_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// выработать имитовставку
	beltMACStart(state, key, len);
	beltMACStepA(src, count, state);
	beltMACStepG(mac, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}